

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

Value * __thiscall
camp::Function::call(Value *__return_storage_ptr__,Function *this,UserObject *object,Args *args)

{
  bool bVar1;
  ForbiddenCall *__return_storage_ptr___00;
  string *psVar2;
  size_t sVar3;
  size_type sVar4;
  NotEnoughArguments *__return_storage_ptr___01;
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [32];
  NotEnoughArguments local_118;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [48];
  ForbiddenCall local_70;
  Args *local_28;
  Args *args_local;
  UserObject *object_local;
  Function *this_local;
  
  local_28 = args;
  args_local = (Args *)object;
  object_local = (UserObject *)this;
  this_local = (Function *)__return_storage_ptr__;
  bVar1 = callable(this,object);
  if (!bVar1) {
    local_ca = 1;
    __return_storage_ptr___00 = (ForbiddenCall *)__cxa_allocate_exception(0x48);
    psVar2 = name_abi_cxx11_(this);
    ForbiddenCall::ForbiddenCall(&local_70,psVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/function.cpp"
               ,&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c8,"Value camp::Function::call(const UserObject &, const Args &) const",
               &local_c9);
    Error::prepare<camp::ForbiddenCall>
              (__return_storage_ptr___00,&local_70,(string *)local_a0,0x52,(string *)local_c8);
    local_ca = 0;
    __cxa_throw(__return_storage_ptr___00,&ForbiddenCall::typeinfo,ForbiddenCall::~ForbiddenCall);
  }
  sVar3 = Args::count(local_28);
  sVar4 = std::vector<camp::Type,_std::allocator<camp::Type>_>::size(&this->m_argTypes);
  if (sVar3 < sVar4) {
    __return_storage_ptr___01 = (NotEnoughArguments *)__cxa_allocate_exception(0x48);
    psVar2 = name_abi_cxx11_(this);
    sVar3 = Args::count(local_28);
    sVar4 = std::vector<camp::Type,_std::allocator<camp::Type>_>::size(&this->m_argTypes);
    NotEnoughArguments::NotEnoughArguments(&local_118,psVar2,sVar3,sVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_138,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/function.cpp"
               ,&local_139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_160,"Value camp::Function::call(const UserObject &, const Args &) const",
               &local_161);
    Error::prepare<camp::NotEnoughArguments>
              (__return_storage_ptr___01,&local_118,(string *)local_138,0x56,(string *)local_160);
    __cxa_throw(__return_storage_ptr___01,&NotEnoughArguments::typeinfo,
                NotEnoughArguments::~NotEnoughArguments);
  }
  (*(this->super_TagHolder)._vptr_TagHolder[3])(__return_storage_ptr__,this,args_local,local_28);
  return __return_storage_ptr__;
}

Assistant:

Value Function::call(const UserObject& object, const Args& args) const
{
    // Check if the function is callable
    if (!callable(object))
        CAMP_ERROR(ForbiddenCall(name()));

    // Check the number of arguments
    if (args.count() < m_argTypes.size())
        CAMP_ERROR(NotEnoughArguments(name(), args.count(), m_argTypes.size()));

    // Execute the function
    return execute(object, args);
}